

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O1

int __thiscall miniros::ServiceManager::shutdown(ServiceManager *this,int __fd,int __how)

{
  size_t *psVar1;
  size_t sVar2;
  int iVar3;
  ServiceManager *pSVar4;
  string *psVar5;
  list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
  local_service_clients;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->shutting_down_mutex_);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (this->shutting_down_ == false) {
    this->shutting_down_ = true;
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown::loc.initialized_ == false) {
      psVar1 = &local_service_clients.
                super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                ._M_impl._M_node._M_size;
      local_service_clients.
      super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_service_clients,"miniros.service_manager","");
      console::initializeLogLocation(&shutdown::loc,(string *)&local_service_clients,Debug);
      if (local_service_clients.
          super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar1) {
        operator_delete(local_service_clients.
                        super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next,
                        local_service_clients.
                        super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                        ._M_impl._M_node._M_size + 1);
      }
    }
    if (shutdown::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown::loc,Debug);
      console::checkLogLocationEnabled(&shutdown::loc);
    }
    if (shutdown::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown::loc.logger_,shutdown::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                     ,0x5c,"void miniros::ServiceManager::shutdown()",
                     "ServiceManager::shutdown(): unregistering our advertised services");
    }
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->service_publications_mutex_);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    pSVar4 = this;
    while (pSVar4 = (ServiceManager *)
                    (pSVar4->service_publications_).
                    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next, pSVar4 != this) {
      unregisterService(this,(string *)
                             ((pSVar4->service_publications_).
                              super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                              ._M_impl._M_node._M_size + 0x10));
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (shutdown()::loc.initialized_ == false) {
        local_service_clients.
        super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
        ._M_impl._M_node.super__List_node_base._M_next =
             (_List_node_base *)
             &local_service_clients.
              super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
              ._M_impl._M_node._M_size;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_service_clients,"miniros.service_manager","");
        console::initializeLogLocation(&shutdown()::loc,(string *)&local_service_clients,Debug);
        if (local_service_clients.
            super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
            ._M_impl._M_node.super__List_node_base._M_next !=
            (_List_node_base *)
            &local_service_clients.
             super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
             ._M_impl._M_node._M_size) {
          operator_delete(local_service_clients.
                          super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,
                          local_service_clients.
                          super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                          ._M_impl._M_node._M_size + 1);
        }
      }
      if (shutdown()::loc.level_ != Debug) {
        console::setLogLocationLevel(&shutdown()::loc,Debug);
        console::checkLogLocationEnabled(&shutdown()::loc);
      }
      if (shutdown()::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,shutdown()::loc.logger_,shutdown()::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,99,"void miniros::ServiceManager::shutdown()","shutting down service %s",
                       *(undefined8 *)
                        ((pSVar4->service_publications_).
                         super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                         ._M_impl._M_node._M_size + 0x10));
      }
      ServicePublication::drop
                ((ServicePublication *)
                 (pSVar4->service_publications_).
                 super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                 ._M_impl._M_node._M_size);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ::_M_clear((_List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                *)this);
    (this->service_publications_).
    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
    (this->service_publications_).
    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
    (this->service_publications_).
    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ._M_impl._M_node._M_size = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_publications_mutex_);
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node._M_size = 0;
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_service_clients;
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_service_clients;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->service_server_links_mutex_);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    std::__detail::_List_node_base::swap
              ((_List_node_base *)&local_service_clients,
               (_List_node_base *)&this->service_server_links_);
    sVar2 = (this->service_server_links_).
            super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
            ._M_impl._M_node._M_size;
    (this->service_server_links_).
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node._M_size =
         local_service_clients.
         super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
         ._M_impl._M_node._M_size;
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node._M_size = sVar2;
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_server_links_mutex_);
    psVar5 = (string *)&local_service_clients;
    while (psVar5 = (string *)(psVar5->_M_dataplus)._M_p, psVar5 != (string *)&local_service_clients
          ) {
      Connection::drop(*(Connection **)((psVar5->field_2)._M_allocated_capacity + 0x18),Destructing)
      ;
    }
    std::__cxx11::
    _List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::_M_clear((_List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                *)&local_service_clients);
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node._M_size = 0;
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_service_clients;
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_service_clients;
    std::__cxx11::
    _List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::_M_clear((_List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                *)&local_service_clients);
  }
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->shutting_down_mutex_);
  return iVar3;
}

Assistant:

void ServiceManager::shutdown()
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return;
  }

  shutting_down_ = true;

  MINIROS_DEBUG("ServiceManager::shutdown(): unregistering our advertised services");
  {
    std::scoped_lock<std::mutex> ss_lock(service_publications_mutex_);

    for (auto i = service_publications_.begin(); i != service_publications_.end(); ++i)
    {
      unregisterService((*i)->getName());
      MINIROS_DEBUG( "shutting down service %s", (*i)->getName().c_str());
      (*i)->drop();
    }
    service_publications_.clear();
  }

  std::list<ServiceServerLinkPtr> local_service_clients;
  {
    std::scoped_lock<std::mutex> lock(service_server_links_mutex_);
    local_service_clients.swap(service_server_links_);
  }
  for (const auto& link: local_service_clients)
  {
    link->getConnection()->drop(Connection::Destructing);
  }

  local_service_clients.clear();
}